

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O2

int ztparseFallback(int iToken)

{
  return 0;
}

Assistant:

int ztparseFallback(int iToken){
#ifdef YYFALLBACK
  assert( iToken<(int)(sizeof(yyFallback)/sizeof(yyFallback[0])) );
  return yyFallback[iToken];
#else
  (void)iToken;
  return 0;
#endif
}